

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void FunctionalTester<unsigned_short,_void>::Test(void)

{
  unsigned_short *arg;
  char local_a4 [8];
  buf_t buf1;
  buf_t buf2;
  TestWatcher<unsigned_short> tw;
  
  TestWatcher<unsigned_short>::TestWatcher((TestWatcher<unsigned_short> *)(buf2._M_elems + 0x3b));
  for (buf2._M_elems._56_2_ = 0; buf2._M_elems._56_2_ != 0xffff;
      buf2._M_elems._56_2_ = buf2._M_elems._56_2_ + 1) {
    int2str::convert_with_zero<unsigned_short,char*>(buf2._M_elems._56_2_,local_a4);
    boost::lexical_cast<std::array<char,64ul>,unsigned_short>
              ((array<char,_64UL> *)(buf1._M_elems + 0x38),(boost *)(buf2._M_elems + 0x38),arg);
    StrcmpAndExit(local_a4,buf1._M_elems + 0x38);
  }
  TestWatcher<unsigned_short>::~TestWatcher((TestWatcher<unsigned_short> *)(buf2._M_elems + 0x3b));
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }